

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.hpp
# Opt level: O1

int __thiscall StringBTree::lessThanKeyCompareOp(StringBTree *this,KeyType *key,uint8_t *data)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  byte *data_00;
  ulong uVar5;
  
  uVar5 = (ulong)*data;
  data_00 = data + 1;
  if ((char)*data < '\0') {
    uVar4 = 0x80;
    do {
      uVar3 = (uVar5 - uVar4) * 0x100;
      bVar1 = *data_00;
      data_00 = data_00 + 1;
      uVar5 = bVar1 | uVar3;
      uVar4 = uVar4 << 7;
    } while ((uVar3 & uVar4) != 0);
  }
  iVar2 = equalKeyCompareOp(this,key,data_00);
  return iVar2 + (uint)(iVar2 == 0);
}

Assistant:

int lessThanKeyCompareOp(const KeyType& key, const uint8_t* data) const
	{
		// TODO: figure out
		const auto unk = static_cast<uint32_t>(decodeBitsAndAdvance(data));

		const auto result = equalKeyCompareOp(key, data);
		
		return (result != 0) ? result : 1;
	}